

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTextUsage.cpp
# Opt level: O2

EStatusCode RunTrueTypeTest(char **argv,bool inEmbedFonts)

{
  EStatusCode EVar1;
  EncryptionOptions *pEVar2;
  PDFPage *this;
  PageContentContext *inPageContext;
  PDFUsedFont *inFontReference;
  undefined7 in_register_00000031;
  char *__s;
  allocator<char> local_1032;
  allocator<char> local_1031;
  undefined1 local_1030 [48];
  PDFCreationSettings local_1000;
  string local_fa0;
  string local_f80;
  string local_f60;
  string local_f40;
  EncryptionOptions local_f20;
  PDFWriter pdfWriter;
  
  PDFWriter::PDFWriter(&pdfWriter);
  __s = "SimpleTextUsageTrueTypeNoEmbed.pdf";
  if ((int)CONCAT71(in_register_00000031,inEmbedFonts) != 0) {
    __s = "SimpleTextUsageTrueType.pdf";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f40,__s,&local_1031);
  BuildRelativeOutputPath(&local_fa0,argv,&local_f40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f80,"SimpleTextUsage.log",&local_1032);
  BuildRelativeOutputPath(&local_f60,argv,&local_f80);
  LogConfiguration::LogConfiguration((LogConfiguration *)local_1030,true,true,&local_f60);
  pEVar2 = EncryptionOptions::DefaultEncryptionOptions();
  EncryptionOptions::EncryptionOptions(&local_f20,pEVar2);
  PDFCreationSettings::PDFCreationSettings(&local_1000,true,inEmbedFonts,&local_f20,false);
  EVar1 = PDFWriter::StartPDF(&pdfWriter,&local_fa0,ePDFVersion13,(LogConfiguration *)local_1030,
                              &local_1000);
  EncryptionOptions::~EncryptionOptions(&local_1000.DocumentEncryptionOptions);
  EncryptionOptions::~EncryptionOptions(&local_f20);
  std::__cxx11::string::~string((string *)(local_1030 + 8));
  std::__cxx11::string::~string((string *)&local_f60);
  std::__cxx11::string::~string((string *)&local_f80);
  std::__cxx11::string::~string((string *)&local_fa0);
  std::__cxx11::string::~string((string *)&local_f40);
  if (EVar1 == eSuccess) {
    this = (PDFPage *)operator_new(0x2b8);
    PDFPage::PDFPage(this);
    PDFRectangle::PDFRectangle((PDFRectangle *)&local_1000,0.0,0.0,595.0,842.0);
    PDFPage::SetMediaBox(this,(PDFRectangle *)&local_1000);
    PDFRectangle::~PDFRectangle((PDFRectangle *)&local_1000);
    inPageContext = PDFWriter::StartPageContentContext(&pdfWriter,this);
    if (inPageContext == (PageContentContext *)0x0) {
      std::operator<<((ostream *)&std::cout,"failed to create content context for page\n");
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1030,"fonts/arial.ttf",(allocator<char> *)&local_fa0);
      BuildRelativeInputPath((string *)&local_1000,argv,(string *)local_1030);
      inFontReference = PDFWriter::GetFontForFile(&pdfWriter,(string *)&local_1000,0);
      std::__cxx11::string::~string((string *)&local_1000);
      std::__cxx11::string::~string((string *)local_1030);
      if (inFontReference != (PDFUsedFont *)0x0) {
        AbstractContentContext::BT(&inPageContext->super_AbstractContentContext);
        AbstractContentContext::k(&inPageContext->super_AbstractContentContext,0.0,0.0,0.0,1.0);
        AbstractContentContext::Tf(&inPageContext->super_AbstractContentContext,inFontReference,1.0)
        ;
        AbstractContentContext::Tm
                  (&inPageContext->super_AbstractContentContext,30.0,0.0,0.0,30.0,78.4252,662.8997);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1000,"hello world",(allocator<char> *)local_1030);
        EVar1 = AbstractContentContext::Tj
                          (&inPageContext->super_AbstractContentContext,(string *)&local_1000);
        std::__cxx11::string::~string((string *)&local_1000);
        if (EVar1 != eSuccess) {
          std::operator<<((ostream *)&std::cout,"Could not find some of the glyphs for this font");
        }
        AbstractContentContext::ET(&inPageContext->super_AbstractContentContext);
        EVar1 = PDFWriter::EndPageContentContext(&pdfWriter,inPageContext);
        if (EVar1 == eSuccess) {
          EVar1 = PDFWriter::WritePageAndRelease(&pdfWriter,this);
          if (EVar1 == eSuccess) {
            EVar1 = PDFWriter::EndPDF(&pdfWriter);
            if (EVar1 == eSuccess) {
              EVar1 = eSuccess;
            }
            else {
              std::operator<<((ostream *)&std::cout,"failed in end PDF\n");
            }
          }
          else {
            std::operator<<((ostream *)&std::cout,"failed to write page\n");
          }
        }
        else {
          std::operator<<((ostream *)&std::cout,"failed to end page content context\n");
        }
        goto LAB_00143f48;
      }
      std::operator<<((ostream *)&std::cout,"Failed to create font object for arial.ttf\n");
    }
    EVar1 = eFailure;
  }
  else {
    std::operator<<((ostream *)&std::cout,"failed to start PDF\n");
  }
LAB_00143f48:
  PDFWriter::~PDFWriter(&pdfWriter);
  return EVar1;
}

Assistant:

static EStatusCode RunTrueTypeTest(char* argv[],bool inEmbedFonts)
{
	PDFWriter pdfWriter;
	EStatusCode status; 

	do
	{
		status = pdfWriter.StartPDF(
			BuildRelativeOutputPath(argv, inEmbedFonts ? "SimpleTextUsageTrueType.pdf" : "SimpleTextUsageTrueTypeNoEmbed.pdf"),
                                    ePDFVersion13,
                                    LogConfiguration(true,true,BuildRelativeOutputPath(argv,"SimpleTextUsage.log")),
									PDFCreationSettings(true,inEmbedFonts));
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to start PDF\n";
			break;
		}	

		PDFPage* page = new PDFPage();
		page->SetMediaBox(PDFRectangle(0,0,595,842));

		PageContentContext* contentContext = pdfWriter.StartPageContentContext(page);
		if(NULL == contentContext)
		{
			status = PDFHummus::eFailure;
			cout<<"failed to create content context for page\n";
			break;
		}

		PDFUsedFont* font = pdfWriter.GetFontForFile(
                                BuildRelativeInputPath(argv,"fonts/arial.ttf"));
		if(!font)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to create font object for arial.ttf\n";
			break;
		}


		// Draw some text
		contentContext->BT();
		contentContext->k(0,0,0,1);

		contentContext->Tf(font,1);

		contentContext->Tm(30,0,0,30,78.4252,662.8997);

		EStatusCode encodingStatus = contentContext->Tj("hello world");
		if(encodingStatus != PDFHummus::eSuccess)
			cout<<"Could not find some of the glyphs for this font";

		// continue even if failed...want to see how it looks like
		contentContext->ET();

		status = pdfWriter.EndPageContentContext(contentContext);
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to end page content context\n";
			break;
		}

		status = pdfWriter.WritePageAndRelease(page);
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to write page\n";
			break;
		}

		status = pdfWriter.EndPDF();
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed in end PDF\n";
			break;
		}
	}while(false);
	return status;	
}